

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

PipelineWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateComputePipeline
          (PipelineWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkComputePipelineCreateInfo *PipelineCI,VkPipelineCache cache,char *DebugName)

{
  VkResult errorCode;
  char local_69;
  char *DebugName_local;
  VkPipeline vkPipeline;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  char *local_30;
  
  DebugName_local = DebugName;
  if (PipelineCI->sType != VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[67]>
              ((string *)&vkPipeline,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO",
               (char (*) [67])cache);
    Diligent::DebugAssertionFailed
              ((Char *)vkPipeline,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x10d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vkPipeline != &local_50) {
      operator_delete(vkPipeline,local_50._M_allocated_capacity + 1);
    }
  }
  if (DebugName_local == (char *)0x0) {
    DebugName_local = "";
  }
  vkPipeline = (VkPipeline)0x0;
  errorCode = (*vkCreateComputePipelines)
                        (this->m_VkDevice,cache,1,PipelineCI,this->m_VkAllocator,&vkPipeline);
  if (errorCode != VK_SUCCESS) {
    local_69 = '\'';
    local_30 = VkResultToString(errorCode);
    Diligent::LogError<true,char[36],char_const*,char,char[17],char_const*>
              (false,"CreateComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x115,(char (*) [36])"Failed to create compute pipeline \'",&DebugName_local,
               &local_69,(char (*) [17])"\nVK Error Code: ",&local_30);
  }
  if (*DebugName_local != '\0') {
    SetPipelineName(this->m_VkDevice,vkPipeline,DebugName_local);
  }
  std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
            ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2> *)
             &local_40,
             (__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)this);
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_40;
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_38;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->m_VkObject = vkPipeline;
  vkPipeline = (VkPipeline)0x0;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineWrapper VulkanLogicalDevice::CreateComputePipeline(const VkComputePipelineCreateInfo& PipelineCI,
                                                           VkPipelineCache                    cache,
                                                           const char*                        DebugName) const
{
    VERIFY_EXPR(PipelineCI.sType == VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO);

    if (DebugName == nullptr)
        DebugName = "";

    VkPipeline vkPipeline = VK_NULL_HANDLE;

    VkResult err = vkCreateComputePipelines(m_VkDevice, cache, 1, &PipelineCI, m_VkAllocator, &vkPipeline);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create compute pipeline '", DebugName, '\'');

    if (*DebugName != 0)
        SetPipelineName(m_VkDevice, vkPipeline, DebugName);

    return PipelineWrapper{GetSharedPtr(), std::move(vkPipeline)};
}